

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,StringRef Separator,int MaxSplit,
          bool KeepEmpty)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  StringRef Str;
  StringRef local_68;
  SmallVectorImpl<llvm::StringRef> *local_50;
  char *local_48;
  StringRef local_40;
  
  local_48 = Separator.Data;
  local_68.Data = this->Data;
  local_68.Length = this->Length;
  local_50 = A;
  if (MaxSplit != 0) {
    do {
      Str.Length = Separator.Length;
      Str.Data = local_48;
      sVar3 = find(&local_68,Str,0);
      sVar2 = local_68.Length;
      pcVar1 = local_68.Data;
      if (sVar3 == 0xffffffffffffffff) break;
      if (sVar3 != 0 || KeepEmpty) {
        local_40.Length = sVar3;
        if (local_68.Length < sVar3) {
          local_40.Length = local_68.Length;
        }
        local_40.Data = local_68.Data;
        SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                  (&local_50->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_40);
      }
      MaxSplit = MaxSplit + -1;
      uVar4 = sVar3 + Separator.Length;
      if (sVar2 < uVar4) {
        uVar4 = sVar2;
      }
      local_68.Data = pcVar1 + uVar4;
      local_68.Length = sVar2 - uVar4;
    } while (MaxSplit != 0);
  }
  if ((KeepEmpty) || (local_68.Length != 0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&local_50->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_68);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A,
                      StringRef Separator, int MaxSplit,
                      bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + Separator.size(), npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}